

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

ssize_t __thiscall QIODevice::read(QIODevice *this,int __fd,void *__buf,size_t __nbytes)

{
  uint uVar1;
  QIODevicePrivate *this_00;
  QRingBuffer *pQVar2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  char *what;
  undefined4 in_register_00000034;
  
  this_00 = (QIODevicePrivate *)(this->super_QObject).d_ptr.d;
  uVar1 = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
          super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
  if ((uVar1 & 1) == 0) {
    if (uVar1 == 0) {
      what = "device not open";
    }
    else {
      what = "WriteOnly device";
    }
  }
  else {
    bVar3 = QIODevicePrivate::isSequential(this_00);
    if (__buf == (void *)0x1) {
      if ((bVar3) && (this_00->transactionStarted != false)) goto LAB_0022ab2e;
      while (iVar4 = QIODevicePrivate::QRingBufferRef::getChar(&this_00->buffer), iVar4 != -1) {
        if (!bVar3) {
          this_00->pos = this_00->pos + 1;
        }
        if (((char)iVar4 != '\r') ||
           (((this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 0x10) == 0)) {
          *(char *)CONCAT44(in_register_00000034,__fd) = (char)iVar4;
          pQVar2 = (this_00->buffer).m_buf;
          if ((pQVar2 != (QRingBuffer *)0x0) && (pQVar2->bufferSize != 0)) {
            return 1;
          }
          (*(this->super_QObject)._vptr_QObject[0x19])
                    (this,(char *)CONCAT44(in_register_00000034,__fd),0);
          return 1;
        }
      }
    }
    if (-1 < (long)__buf) {
LAB_0022ab2e:
      sVar5 = QIODevicePrivate::read(this_00,__fd,__buf,0);
      return sVar5;
    }
    what = "Called with maxSize < 0";
  }
  checkWarnMessage(this,"read",what);
  return -1;
}

Assistant:

qint64 QIODevice::read(char *data, qint64 maxSize)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::read(%p, %lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, data, maxSize, d->pos, d->buffer.size());
#endif

    CHECK_READABLE(read, qint64(-1));
    const bool sequential = d->isSequential();

    // Short-cut for getChar(), unless we need to keep the data in the buffer.
    if (maxSize == 1 && !(sequential && d->transactionStarted)) {
        int chint;
        while ((chint = d->buffer.getChar()) != -1) {
            if (!sequential)
                ++d->pos;

            char c = char(uchar(chint));
            if (c == '\r' && (d->openMode & Text))
                continue;
            *data = c;
#if defined QIODEVICE_DEBUG
            printf("%p \tread 0x%hhx (%c) returning 1 (shortcut)\n", this,
                   int(c), isAsciiPrintable(c) ? c : '?');
#endif
            if (d->buffer.isEmpty())
                readData(data, 0);
            return qint64(1);
        }
    }

    CHECK_MAXLEN(read, qint64(-1));
    const qint64 readBytes = d->read(data, maxSize);

#if defined QIODEVICE_DEBUG
    printf("%p \treturning %lld, d->pos == %lld, d->buffer.size() == %lld\n", this,
           readBytes, d->pos, d->buffer.size());
    if (readBytes > 0)
        debugBinaryString(data - readBytes, readBytes);
#endif

    return readBytes;
}